

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void test_decode_invalid_message_long(void)

{
  byte bVar1;
  long lVar2;
  int *piVar3;
  uint8_t *message;
  size_t message_len;
  char encoded [82];
  undefined1 local_28 [8];
  uint8_t key [32];
  
  bVar1 = paseto_v2_local_load_key_base64(local_28,"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw");
  if ((bVar1 & 1) != 1) {
    __assert_fail("paseto_v2_local_load_key_base64(key, \"gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw\") == true"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                  ,0x60,"void test_decode_invalid_message_long(void)");
  }
  memcpy(&message_len,
         "v2.local.AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA",0x52);
  message = (uint8_t *)0x0;
  lVar2 = paseto_v2_local_decrypt(&message_len,&message,local_28,0);
  piVar3 = __errno_location();
  if (*piVar3 == 0x16) {
    if (lVar2 == 0) {
      return;
    }
    __assert_fail("message == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                  ,0x65,"void test_decode_invalid_message_long(void)");
  }
  __assert_fail("errno == EINVAL",
                "/workspace/llm4binary/github/license_c_cmakelists/authenticvision[P]libpaseto/test/test.c"
                ,100,"void test_decode_invalid_message_long(void)");
}

Assistant:

static void test_decode_invalid_message_long(void) {
    uint8_t key[paseto_v2_LOCAL_KEYBYTES];
    assert(paseto_v2_local_load_key_base64(key, "gHgVofOGvySsqUnTsAJusgGCJbWFiiqYN1pWzuQGjxw") == true);
    const char encoded[] = "v2.local.AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA";
    size_t message_len = 0;
    uint8_t *message = paseto_v2_local_decrypt(encoded, &message_len, key, NULL, 0);
    assert(errno == EINVAL);
    assert(message == NULL);
}